

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTransaction::SetTxOutCommitment
          (ConfidentialTransaction *this,uint32_t index,ConfidentialAssetId *asset,
          ConfidentialValue *value,ConfidentialNonce *nonce,ByteData *surjection_proof,
          ByteData *range_proof)

{
  long lVar1;
  uchar *asset_00;
  size_type asset_len;
  uchar *value_00;
  size_type value_len;
  uchar *nonce_00;
  size_type nonce_len;
  uchar *surjectionproof;
  size_type surjectionproof_len;
  uchar *rangeproof;
  size_type rangeproof_len;
  CfdException *this_00;
  reference this_01;
  ulong uVar2;
  allocator local_191;
  string local_190;
  CfdSourceLocation local_170;
  int local_154;
  void *pvStack_150;
  int ret;
  wally_tx *tx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *range_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *surjection_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *nonce_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value_data;
  ByteData local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *asset_data;
  ByteData *surjection_proof_local;
  ConfidentialNonce *nonce_local;
  ConfidentialValue *value_local;
  ConfidentialAssetId *asset_local;
  ConfidentialTransaction *pCStack_28;
  uint32_t index_local;
  ConfidentialTransaction *this_local;
  
  asset_data = &surjection_proof->data_;
  surjection_proof_local = (ByteData *)nonce;
  nonce_local = (ConfidentialNonce *)value;
  value_local = (ConfidentialValue *)asset;
  asset_local._4_4_ = index;
  pCStack_28 = this;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,(ulong)index,0x8fa,"SetTxOutCommitment");
  ConfidentialAssetId::GetData(&local_88,(ConfidentialAssetId *)value_local);
  ByteData::GetBytes(&local_70,&local_88);
  ByteData::~ByteData(&local_88);
  local_58 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70;
  ConfidentialValue::GetData((ByteData *)&nonce_data,(ConfidentialValue *)nonce_local);
  ByteData::GetBytes(&local_b8,(ByteData *)&nonce_data);
  ByteData::~ByteData((ByteData *)&nonce_data);
  local_a0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8;
  ConfidentialNonce::GetData
            ((ByteData *)&surjection_data,(ConfidentialNonce *)surjection_proof_local);
  ByteData::GetBytes(&local_f0,(ByteData *)&surjection_data);
  ByteData::~ByteData((ByteData *)&surjection_data);
  local_d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&range_data,
                     (ByteData *)asset_data);
  local_110 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&range_data;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,range_proof);
  local_130 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx;
  pvStack_150 = (this->super_AbstractTransaction).wally_tx_pointer_;
  lVar1 = *(long *)((long)pvStack_150 + 0x20);
  uVar2 = (ulong)asset_local._4_4_;
  asset_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_58);
  asset_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_58);
  value_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_a0);
  value_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_a0);
  nonce_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_d8);
  nonce_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8);
  surjectionproof = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_110);
  surjectionproof_len =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_110);
  rangeproof = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_130);
  rangeproof_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_130);
  local_154 = wally_tx_elements_output_commitment_set
                        ((wally_tx_output *)(lVar1 + uVar2 * 0x70),asset_00,asset_len,value_00,
                         value_len,nonce_00,nonce_len,surjectionproof,surjectionproof_len,rangeproof
                         ,rangeproof_len);
  if (local_154 != 0) {
    local_170.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_170.filename = local_170.filename + 1;
    local_170.line = 0x90a;
    local_170.funcname = "SetTxOutCommitment";
    logger::warn<int&>(&local_170,"wally_tx_elements_output_commitment_set NG[{}].",&local_154);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_190,"set commitment error.",&local_191);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_190);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this_01 = ::std::
            vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
            operator[](&this->vout_,(ulong)asset_local._4_4_);
  ConfidentialTxOut::SetCommitment
            (this_01,(ConfidentialAssetId *)value_local,(ConfidentialValue *)nonce_local,
             (ConfidentialNonce *)surjection_proof_local,(ByteData *)asset_data,range_proof);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&range_data);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  return;
}

Assistant:

void ConfidentialTransaction::SetTxOutCommitment(
    uint32_t index, const ConfidentialAssetId &asset,
    const ConfidentialValue &value, const ConfidentialNonce &nonce,
    const ByteData &surjection_proof, const ByteData &range_proof) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  const std::vector<uint8_t> &asset_data = asset.GetData().GetBytes();
  const std::vector<uint8_t> &value_data = value.GetData().GetBytes();
  const std::vector<uint8_t> &nonce_data = nonce.GetData().GetBytes();
  const std::vector<uint8_t> &surjection_data = surjection_proof.GetBytes();
  const std::vector<uint8_t> &range_data = range_proof.GetBytes();

  struct wally_tx *tx = static_cast<struct wally_tx *>(wally_tx_pointer_);
  int ret = wally_tx_elements_output_commitment_set(
      &tx->outputs[index], asset_data.data(), asset_data.size(),
      value_data.data(), value_data.size(), nonce_data.data(),
      nonce_data.size(), surjection_data.data(), surjection_data.size(),
      range_data.data(), range_data.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_output_commitment_set NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "set commitment error.");
  }

  vout_[index].SetCommitment(
      asset, value, nonce, surjection_proof, range_proof);
}